

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void QUnifiedTimer::startAnimationTimer(QAbstractAnimationTimer *timer)

{
  QUnifiedTimer *this;
  long in_RDI;
  undefined7 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  QUnifiedTimer *inst;
  parameter_type in_stack_ffffffffffffffe8;
  ConnectionType c;
  
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x10) = 1;
    this = instance((bool)unaff_retaddr_00);
    c = (ConnectionType)((ulong)in_RDI >> 0x20);
    QList<QAbstractAnimationTimer_*>::operator<<
              ((QList<QAbstractAnimationTimer_*> *)this,in_stack_ffffffffffffffe8);
    if ((this->startTimersPending & 1U) == 0) {
      this->startTimersPending = true;
      QMetaObject::invokeMethod<>
                (&inst->super_QObject,(char *)CONCAT17(unaff_retaddr_00,unaff_retaddr),c);
    }
  }
  return;
}

Assistant:

void QUnifiedTimer::startAnimationTimer(QAbstractAnimationTimer *timer)
{
    if (timer->isRegistered)
        return;
    timer->isRegistered = true;

    QUnifiedTimer *inst = instance(true); //we create the instance if needed
    inst->animationTimersToStart << timer;
    if (!inst->startTimersPending) {
        inst->startTimersPending = true;
        QMetaObject::invokeMethod(inst, "startTimers", Qt::QueuedConnection);
    }
}